

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowConstantAggregator::Evaluate
          (WindowConstantAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate
          ,DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  WindowAggregatorState *sel_p;
  data_ptr_t pdVar1;
  ulong uVar2;
  type source_p;
  const_reference pvVar3;
  const_reference pvVar4;
  idx_t iVar5;
  idx_t source_count;
  idx_t iVar6;
  idx_t target_offset;
  
  source_p = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        &gsink[0xc].allocator.arena_allocator.reallocate_function);
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  pdVar1 = pvVar3->data;
  sel_p = lstate + 10;
  target_offset = 0;
  source_count = 0;
  for (iVar5 = 0; iVar5 != count; iVar5 = iVar5 + 1) {
    uVar2 = *(ulong *)(pdVar1 + iVar5 * 8);
    iVar6 = lstate[9].allocator.allocated_size;
    while( true ) {
      pvVar4 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)
                          &gsink[6].allocator.arena_allocator.free_function,iVar6 + 1);
      if (uVar2 < *pvVar4) break;
      if (source_count != 0) {
        VectorOperations::Copy
                  (source_p,result,(SelectionVector *)sel_p,source_count,0,target_offset);
        target_offset = target_offset + source_count;
      }
      iVar6 = lstate[9].allocator.allocated_size + 1;
      lstate[9].allocator.allocated_size = iVar6;
      source_count = 0;
    }
    *(int *)((long)lstate[10]._vptr_WindowAggregatorState + source_count * 4) =
         (int)lstate[9].allocator.allocated_size;
    source_count = source_count + 1;
  }
  if (source_count != 0) {
    if (count == source_count && target_offset == 0) {
      VectorOperations::Copy(source_p,result,(SelectionVector *)sel_p,1,0,0);
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      return;
    }
    VectorOperations::Copy(source_p,result,(SelectionVector *)sel_p,source_count,0,target_offset);
    return;
  }
  return;
}

Assistant:

void WindowConstantAggregator::Evaluate(const WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                        const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gasink = gsink.Cast<WindowConstantAggregatorGlobalState>();
	const auto &partition_offsets = gasink.partition_offsets;
	const auto &results = *gasink.results;

	auto begins = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	//	Chunk up the constants and copy them one at a time
	auto &lcstate = lstate.Cast<WindowConstantAggregatorLocalState>();
	idx_t matched = 0;
	idx_t target_offset = 0;
	for (idx_t i = 0; i < count; ++i) {
		const auto begin = begins[i];
		//	Find the partition containing [begin, end)
		while (partition_offsets[lcstate.partition + 1] <= begin) {
			//	Flush the previous partition's data
			if (matched) {
				VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
				target_offset += matched;
				matched = 0;
			}
			++lcstate.partition;
		}

		lcstate.matches.set_index(matched++, lcstate.partition);
	}

	//	Flush the last partition
	if (matched) {
		// Optimize constant result
		if (target_offset == 0 && matched == count) {
			VectorOperations::Copy(results, result, lcstate.matches, 1, 0, target_offset);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		} else {
			VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
		}
	}
}